

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void on_tcp_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  char *__s2;
  int iVar1;
  
  if (nread < 1) {
    on_tcp_read_cold_1();
  }
  else {
    __s2 = buf->base;
    iVar1 = bcmp("hello again\n",__s2,nread);
    if (iVar1 == 0) {
      if (tcp == (uv_stream_t *)&tcp_connection) {
        free(__s2);
        tcp_read_cb_called = tcp_read_cb_called + 1;
        uv_close(&tcp_connection,0);
        uv_close(&channel,0);
        return;
      }
      goto LAB_0016360c;
    }
  }
  on_tcp_read_cold_2();
LAB_0016360c:
  on_tcp_read_cold_3();
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void on_tcp_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(nread > 0);
  ASSERT(memcmp("hello again\n", buf->base, nread) == 0);
  ASSERT(tcp == (uv_stream_t*)&tcp_connection);
  free(buf->base);

  tcp_read_cb_called++;

  uv_close((uv_handle_t*)tcp, NULL);
  uv_close((uv_handle_t*)&channel, NULL);
}